

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O2

void Fraig_FeedBack(Fraig_Man_t *p,int *pModel,Msat_IntVec_t *vVars,Fraig_Node_t *pOld,
                   Fraig_Node_t *pNew)

{
  undefined1 *puVar1;
  Fraig_Node_t *pFVar2;
  Msat_IntVec_t *p_00;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  int *piVar6;
  abctime aVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  
  aVar5 = Abc_Clock();
  for (lVar12 = 0; lVar12 < p->vInputs->nSize; lVar12 = lVar12 + 1) {
    puVar1 = &p->vInputs->pArray[lVar12]->field_0x18;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffffff7f;
  }
  uVar3 = Msat_IntVecReadSize(vVars);
  piVar6 = Msat_IntVecReadArray(vVars);
  uVar13 = 0;
  uVar11 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar11 = uVar13;
  }
  iVar14 = 0;
  for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
    pFVar2 = p->vNodes->pArray[piVar6[uVar13]];
    iVar4 = Fraig_NodeIsVar(pFVar2);
    if (iVar4 != 0) {
      uVar3 = *(uint *)&pFVar2->field_0x18;
      *(uint *)&pFVar2->field_0x18 = uVar3 | 0x80;
      *(uint *)&pFVar2->field_0x18 =
           (uVar3 & 0xfffffeff | 0x80 | (pModel[piVar6[uVar13]] & 1U) << 8) ^ 0x100;
      iVar14 = iVar14 + 1;
    }
  }
  iVar4 = (((int)(iVar14 + 1U) >> 5) + 1) - (uint)((iVar14 + 1U & 0x1f) == 0);
  iVar14 = p->nWordsDyna - p->iWordStart;
  if (iVar4 < iVar14) {
    iVar14 = iVar4;
  }
  Msat_IntVecPush(p->vPatsReal,p->iWordStart << 5);
  p->pSimsReal[p->iWordStart] = p->pSimsReal[p->iWordStart] | 1;
  iVar4 = 1;
  for (lVar12 = 0; lVar12 < p->vInputs->nSize; lVar12 = lVar12 + 1) {
    pFVar2 = p->vInputs->pArray[lVar12];
    iVar9 = p->iWordStart;
    lVar10 = (long)iVar9;
    while( true ) {
      uVar3 = *(uint *)&pFVar2->field_0x18;
      if (iVar9 + iVar14 <= lVar10) break;
      if ((char)uVar3 < '\0') {
        if ((uVar3 >> 8 & 1) == 0) {
          pFVar2->puSimD[lVar10] = 0;
        }
        else {
          pFVar2->puSimD[lVar10] = 0xffffffff;
        }
      }
      else {
        uVar3 = Aig_ManRandom(0);
        pFVar2->puSimD[lVar10] = uVar3;
      }
      lVar10 = lVar10 + 1;
      iVar9 = p->iWordStart;
    }
    if (((char)uVar3 < '\0') && (iVar4 < iVar14 * 0x20 + -2)) {
      pFVar2->puSimD[(long)iVar9 + (long)(iVar4 >> 5)] =
           pFVar2->puSimD[(long)iVar9 + (long)(iVar4 >> 5)] ^ 1 << ((byte)iVar4 & 0x1f);
      iVar4 = iVar4 + 1;
      uVar3 = *(uint *)&pFVar2->field_0x18;
    }
    *(uint *)&pFVar2->field_0x18 = uVar3 & 0xffffff7f;
    lVar10 = (long)p->iWordStart;
    lVar8 = iVar14 + lVar10;
    for (; lVar10 < lVar8; lVar10 = lVar10 + 1) {
      pFVar2->uHashD = pFVar2->uHashD ^ s_FraigPrimes[lVar10] * pFVar2->puSimD[lVar10];
    }
  }
  if (p->nWordsDyna < p->iWordStart + iVar14) {
    __assert_fail("p->iWordStart + nWords <= p->nWordsDyna",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigFeed.c"
                  ,0x5b,
                  "void Fraig_FeedBack(Fraig_Man_t *, int *, Msat_IntVec_t *, Fraig_Node_t *, Fraig_Node_t *)"
                 );
  }
  for (lVar12 = 1; lVar12 < p->vNodes->nSize; lVar12 = lVar12 + 1) {
    iVar4 = Fraig_NodeIsAnd(p->vNodes->pArray[lVar12]);
    if (iVar4 != 0) {
      Fraig_NodeSimulate(p->vNodes->pArray[lVar12],p->iWordStart,p->iWordStart + iVar14,0);
    }
  }
  if (p->fDoSparse != 0) {
    Fraig_TableRehashF0(p,0);
  }
  if (p->fChoicing == 0) {
    p_00 = p->vPatsReal;
    iVar4 = Msat_IntVecReadSize(p_00);
    Msat_IntVecReadEntry(p_00,iVar4 + -1);
  }
  iVar14 = iVar14 + p->iWordStart;
  if (iVar14 == p->nWordsDyna) {
    iVar14 = Fraig_FeedBackCompress(p);
  }
  p->iWordStart = iVar14;
  aVar7 = Abc_Clock();
  p->timeFeed = p->timeFeed + (aVar7 - aVar5);
  return;
}

Assistant:

void Fraig_FeedBack( Fraig_Man_t * p, int * pModel, Msat_IntVec_t * vVars, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    int nVarsPi, nWords;
    int i;
    abctime clk = Abc_Clock();

    // get the number of PI vars in the feedback (also sets the PI values)
    nVarsPi = Fraig_FeedBackPrepare( p, pModel, vVars );

    // set the PI values
    nWords = Fraig_FeedBackInsert( p, nVarsPi );
    assert( p->iWordStart + nWords <= p->nWordsDyna );

    // resimulates the words from p->iWordStart to iWordStop
    for ( i = 1; i < p->vNodes->nSize; i++ )
        if ( Fraig_NodeIsAnd(p->vNodes->pArray[i]) )
            Fraig_NodeSimulate( p->vNodes->pArray[i], p->iWordStart, p->iWordStart + nWords, 0 );

    if ( p->fDoSparse )
        Fraig_TableRehashF0( p, 0 );

    if ( !p->fChoicing )
    Fraig_FeedBackVerify( p, pOld, pNew );

    // if there is no room left, compress the patterns
    if ( p->iWordStart + nWords == p->nWordsDyna )
        p->iWordStart = Fraig_FeedBackCompress( p );
    else  // otherwise, update the starting word
        p->iWordStart += nWords;

p->timeFeed += Abc_Clock() - clk;
}